

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

void __thiscall CSnapIDPool::RemoveFirstTimeout(CSnapIDPool *this)

{
  short sVar1;
  int NextTimed;
  CSnapIDPool *this_local;
  
  sVar1 = this->m_aIDs[this->m_FirstTimed].m_Next;
  this->m_aIDs[this->m_FirstTimed].m_Next = (short)this->m_FirstFree;
  this->m_aIDs[this->m_FirstTimed].m_State = 0;
  this->m_FirstFree = this->m_FirstTimed;
  this->m_FirstTimed = (int)sVar1;
  if (this->m_FirstTimed == -1) {
    this->m_LastTimed = -1;
  }
  this->m_Usage = this->m_Usage + -1;
  return;
}

Assistant:

void CSnapIDPool::RemoveFirstTimeout()
{
	int NextTimed = m_aIDs[m_FirstTimed].m_Next;

	// add it to the free list
	m_aIDs[m_FirstTimed].m_Next = m_FirstFree;
	m_aIDs[m_FirstTimed].m_State = 0;
	m_FirstFree = m_FirstTimed;

	// remove it from the timed list
	m_FirstTimed = NextTimed;
	if(m_FirstTimed == -1)
		m_LastTimed = -1;

	m_Usage--;
}